

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::DoubleRange::SharedCtor(DoubleRange *this)

{
  this->minvalue_ = 0.0;
  this->maxvalue_ = 0.0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void DoubleRange::SharedCtor() {
  ::memset(&minvalue_, 0, reinterpret_cast<char*>(&maxvalue_) -
    reinterpret_cast<char*>(&minvalue_) + sizeof(maxvalue_));
  _cached_size_ = 0;
}